

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O1

QSize __thiscall QToolBarLayout::expandedSize(QToolBarLayout *this,QSize *size)

{
  QLayoutStruct *pQVar1;
  double dVar2;
  Representation RVar3;
  Representation RVar4;
  Representation RVar5;
  Representation RVar6;
  int iVar7;
  bool bVar8;
  Orientation OVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  QWidget *this_00;
  long lVar15;
  QStyle *pQVar16;
  ulong uVar17;
  int extraout_var;
  int iVar18;
  long lVar19;
  QSize *pQVar20;
  bool *pbVar21;
  Representation RVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  QSize QVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  long in_FS_OFFSET;
  QMargins QVar33;
  QStyleOptionToolBar opt;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dirty == true) {
    updateGeomArray(this);
  }
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  QVar26.wd.m_i = 0;
  QVar26.ht.m_i = 0;
  if (this_00 != (QWidget *)0x0) {
    lVar15 = QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
    OVar9 = QToolBar::orientation((QToolBar *)this_00);
    pQVar16 = QWidget::style(this_00);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_98);
    (**(code **)(*(long *)this_00 + 0x1a0))(this_00,(QStyleOptionToolBar *)local_98);
    bVar8 = movable(this);
    if (bVar8) {
      uVar10 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x35,local_98,this_00);
      QVar26.ht.m_i = 0;
      QVar26.wd.m_i = uVar10;
    }
    QVar33 = QLayout::contentsMargins(&this->super_QLayout);
    iVar11 = (**(code **)(*(long *)&this->super_QLayout + 0x60))(this);
    iVar12 = (**(code **)(*(long *)pQVar16 + 0xe0))(pQVar16,0x39,local_98,this_00);
    lVar19 = (this->items).d.size;
    if (lVar19 == 0) {
      iVar28 = 0;
      iVar13 = 0;
    }
    else {
      pbVar21 = &((this->geomArray).d.ptr)->empty;
      iVar13 = 0;
      iVar28 = 0;
      do {
        if (*pbVar21 == false) {
          iVar29 = iVar11;
          if (iVar13 == 0) {
            iVar29 = 0;
          }
          iVar28 = iVar29 + iVar28 + *(int *)(pbVar21 + -9);
          iVar13 = iVar13 + 1;
        }
        pbVar21 = pbVar21 + 0x20;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
    }
    if (iVar13 == 0) {
      uVar25 = 0;
      uVar17 = 0;
    }
    else {
      pQVar20 = (QSize *)&size->ht;
      if (OVar9 == Horizontal) {
        pQVar20 = size;
      }
      dVar2 = (double)iVar13;
      uVar10 = (pQVar20->wd).m_i;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      iVar13 = 2;
      if ((int)dVar2 != 1) {
        iVar13 = (int)dVar2;
      }
      iVar28 = iVar28 / iVar13 + iVar11 + iVar12;
      RVar3 = QVar33.m_right.m_i;
      RVar4 = QVar33.m_left.m_i;
      RVar5 = QVar33.m_bottom.m_i;
      RVar6 = QVar33.m_top.m_i;
      iVar13 = RVar5.m_i + RVar6.m_i;
      if (OVar9 == Horizontal) {
        iVar13 = RVar3.m_i + RVar4.m_i;
      }
      RVar22 = QVar26.wd.m_i;
      iVar13 = uVar10 - (iVar13 + RVar22.m_i);
      if (iVar13 < iVar28) {
        iVar13 = iVar28;
      }
      if (lVar15 != 0) {
        lVar19 = *(long *)(lVar15 + 0x20);
        iVar28 = *(int *)(lVar19 + 0x20) - *(int *)(lVar19 + 0x18);
        if (OVar9 == Horizontal) {
          iVar28 = *(int *)(lVar19 + 0x1c) - *(int *)(lVar19 + 0x14);
        }
        iVar29 = RVar5.m_i + RVar6.m_i;
        if (OVar9 == Horizontal) {
          iVar29 = RVar3.m_i + RVar4.m_i;
        }
        iVar28 = (iVar28 + 1) - (iVar29 + RVar22.m_i);
        if (iVar28 <= iVar13) {
          iVar13 = iVar28;
        }
      }
      if ((this->items).d.size == 0) {
        iVar28 = 0;
        iVar29 = 0;
      }
      else {
        iVar27 = 0;
        iVar29 = 0;
        iVar28 = 0;
        do {
          lVar19 = (long)iVar27;
          if (lVar19 < (this->items).d.size) {
            iVar32 = 0;
            iVar7 = -1;
            iVar30 = 0;
            iVar23 = 0;
            do {
              pQVar1 = (this->geomArray).d.ptr;
              iVar18 = iVar23;
              if (pQVar1[lVar19].empty == false) {
                iVar18 = iVar11;
                if (iVar32 == 0) {
                  iVar18 = 0;
                }
                iVar31 = iVar18 + iVar30 + pQVar1[lVar19].minimumSize;
                iVar14 = (*((this->items).d.ptr[lVar19]->super_QWidgetItem).super_QLayoutItem.
                           _vptr_QLayoutItem[2])();
                iVar18 = extraout_var;
                if (OVar9 == Vertical) {
                  iVar18 = iVar14;
                }
                if (iVar18 < iVar23) {
                  iVar18 = iVar23;
                }
                bVar8 = iVar7 != -1;
                if (iVar13 < iVar31 && bVar8) {
                  if ((1 < iVar32) && (iVar13 < iVar11 + iVar12 + iVar30)) {
                    iVar30 = iVar30 - ((this->geomArray).d.ptr[iVar7].minimumSize + iVar11);
                    iVar27 = iVar7;
                  }
                }
                else {
                  iVar32 = iVar32 + 1;
                  iVar30 = iVar31;
                  iVar7 = iVar27;
                }
                if (iVar13 < iVar31 && bVar8) break;
              }
              iVar27 = iVar27 + 1;
              lVar19 = (long)iVar27;
              iVar23 = iVar18;
            } while (lVar19 < (this->items).d.size);
          }
          else {
            iVar30 = 0;
            iVar18 = 0;
          }
          if (iVar28 < iVar30) {
            iVar28 = iVar30;
          }
          iVar29 = iVar29 + iVar11 + iVar18;
        } while ((long)iVar27 < (this->items).d.size);
      }
      uVar24 = RVar22.m_i + RVar4.m_i + iVar11 + RVar3.m_i + iVar12 + iVar28;
      if ((int)uVar24 <= (int)uVar10) {
        uVar24 = uVar10;
      }
      uVar10 = uVar24;
      if (lVar15 != 0) {
        lVar15 = *(long *)(lVar15 + 0x20);
        iVar12 = *(int *)(lVar15 + 0x20) - *(int *)(lVar15 + 0x18);
        if (OVar9 == Horizontal) {
          iVar12 = *(int *)(lVar15 + 0x1c) - *(int *)(lVar15 + 0x14);
        }
        uVar10 = iVar12 + 1U;
        if ((int)uVar24 < (int)(iVar12 + 1U)) {
          uVar10 = uVar24;
        }
      }
      uVar25 = (ulong)uVar10;
      uVar10 = ((RVar5.m_i + RVar6.m_i) - iVar11) + iVar29;
      uVar17 = 0xffffffff;
      if (OVar9 == Horizontal) {
        uVar17 = uVar25;
      }
      if (OVar9 == Vertical) {
        uVar17 = (ulong)uVar10;
      }
      else {
        uVar25 = (ulong)uVar10;
      }
      uVar25 = uVar25 << 0x20;
    }
    QVar26 = (QSize)(uVar25 | uVar17);
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar26;
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBarLayout::expandedSize(const QSize &size) const
{
    if (dirty)
        updateGeomArray();

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return QSize(0, 0);
    QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget());
    Qt::Orientation o = tb->orientation();
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);

    int total_w = 0;
    int count = 0;
    for (int x = 0; x < items.size(); ++x) {
        if (!geomArray[x].empty) {
            total_w += (count == 0 ? 0 : spacing) + geomArray[x].minimumSize;
            ++count;
        }
    }
    if (count == 0)
        return QSize(0, 0);

    int min_w = pick(o, size);
    int rows = (int)qSqrt(qreal(count));
    if (rows == 1)
        ++rows;      // we want to expand to at least two rows
    int space = total_w/rows + spacing + extensionExtent;
    space = qMax(space, min_w - pick(o, margins) - handleExtent);
    if (win != nullptr)
        space = qMin(space, pick(o, win->size()) - pick(o, margins) - handleExtent);

    int w = 0;
    int h = 0;
    int i = 0;
    while (i < items.size()) {
        int count = 0;
        int size = 0;
        int prev = -1;
        int rowHeight = 0;
        for (; i < items.size(); ++i) {
            if (geomArray[i].empty)
                continue;

            int newSize = size + (count == 0 ? 0 : spacing) + geomArray[i].minimumSize;
            rowHeight = qMax(rowHeight, perp(o, items.at(i)->sizeHint()));
            if (prev != -1 && newSize > space) {
                if (count > 1 && size + spacing + extensionExtent > space) {
                    size -= spacing + geomArray[prev].minimumSize;
                    i = prev;
                }
                break;
            }

            size = newSize;
            prev = i;
            ++count;
        }

        w = qMax(size, w);
        h += rowHeight + spacing;
    }

    w += pick(Qt::Horizontal, margins) + handleExtent + spacing + extensionExtent;
    w = qMax(w, min_w);
    if (win != nullptr)
        w = qMin(w, pick(o, win->size()));
    h += pick(Qt::Vertical, margins) - spacing; //there is no spacing before the first row

    QSize result;
    rpick(o, result) = w;
    rperp(o, result) = h;
    return result;
}